

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void __thiscall pybind11::detail::local_internals::local_internals(local_internals *this)

{
  mapped_type *ppvVar1;
  shared_loader_life_support_data *this_00;
  long in_RDI;
  mapped_type *ptr;
  internals *internals;
  key_type *in_stack_ffffffffffffff68;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  *in_stack_ffffffffffffff70;
  allocator local_49;
  string local_48 [32];
  mapped_type *local_28;
  internals *local_10;
  
  std::
  unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
  ::unordered_map((unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                   *)0x2b3509);
  std::
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ::forward_list((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                  *)0x2b351c);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  local_10 = get_internals();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"_life_support",&local_49);
  ppvVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = ppvVar1;
  if (*ppvVar1 == (mapped_type)0x0) {
    this_00 = (shared_loader_life_support_data *)operator_new(8);
    shared_loader_life_support_data::shared_loader_life_support_data(this_00);
    *local_28 = this_00;
  }
  *(undefined8 *)(in_RDI + 0x40) = **local_28;
  return;
}

Assistant:

local_internals() {
        auto &internals = get_internals();
        // Get or create the `loader_life_support_stack_key`.
        auto &ptr = internals.shared_data["_life_support"];
        if (!ptr) {
            ptr = new shared_loader_life_support_data;
        }
        loader_life_support_tls_key
            = static_cast<shared_loader_life_support_data *>(ptr)->loader_life_support_tls_key;
    }